

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_uid_uname.c
# Opt level: O0

void test_option_uid_uname(void)

{
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  char *in_stack_00000010;
  void *in_stack_00000018;
  size_t s;
  char *data;
  char *reference;
  char *in_stack_00000038;
  size_t in_stack_00000050;
  char *in_stack_00000058;
  void *in_stack_00000060;
  char *in_stack_00000478;
  wchar_t in_stack_00000484;
  char *in_stack_00000488;
  undefined8 in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  char *pcVar1;
  longlong in_stack_ffffffffffffffd8;
  longlong lVar2;
  wchar_t in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  char *in_stack_fffffffffffffff8;
  
  assertion_umask(in_stack_ffffffffffffffd0,(wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                  (wchar_t)in_stack_ffffffffffffffc8);
  assertion_make_file(in_stack_00000008,unaff_retaddr_00,in_stack_fffffffffffffff8,
                      (wchar_t)((ulong)in_stack_fffffffffffffff0 >> 0x20),
                      (wchar_t)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  failure("Error invoking %s c",testprog);
  systemf("%s cf archive1 --format=ustar file >stdout1.txt 2>stderr1.txt",testprog);
  assertion_equal_int(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,0,(char *)0x1162cf,
                      (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  slurpfile((size_t *)&stack0xffffffffffffffe8,"archive1");
  failure("Error invoking %s c",testprog);
  systemf("%s cf archive2 --uid=17 --uname=foofoofoo --format=ustar file >stdout2.txt 2>stderr2.txt"
          ,testprog);
  assertion_equal_int(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,0,(char *)0x116375,
                      (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  slurpfile((size_t *)&stack0xffffffffffffffe8,"archive2");
  assertion_equal_mem(in_stack_00000038,reference._4_4_,data,(char *)s,in_stack_00000018,
                      in_stack_00000010,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  pcVar1 = "10";
  lVar2 = 0;
  assertion_equal_mem(in_stack_00000038,reference._4_4_,data,(char *)s,in_stack_00000018,
                      in_stack_00000010,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  failure("Error invoking %s c",testprog);
  systemf("%s cf archive3 --uid=17 --format=ustar file >stdout3.txt 2>stderr3.txt",testprog);
  assertion_equal_int(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,lVar2,pcVar1,0,
                      (char *)0x1164bc,(void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  slurpfile((size_t *)&stack0xffffffffffffffe8,"archive3");
  assertion_equal_mem(in_stack_00000038,reference._4_4_,data,(char *)s,in_stack_00000018,
                      in_stack_00000010,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  pcVar1 = "1";
  lVar2 = 0;
  assertion_equal_mem(in_stack_00000038,reference._4_4_,data,(char *)s,in_stack_00000018,
                      in_stack_00000010,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  failure("Error invoking %s c",testprog);
  systemf("%s cf archive4 --uname=foofoofoo --format=ustar file >stdout4.txt 2>stderr4.txt",testprog
         );
  assertion_equal_int(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,lVar2,pcVar1,0,
                      (char *)0x116603,(void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  slurpfile((size_t *)&stack0xffffffffffffffe8,"archive4");
  assertion_equal_mem(in_stack_00000038,reference._4_4_,data,(char *)s,in_stack_00000018,
                      in_stack_00000010,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  assertion_equal_mem(in_stack_00000038,reference._4_4_,data,(char *)s,in_stack_00000018,
                      in_stack_00000010,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  return;
}

Assistant:

DEFINE_TEST(test_option_uid_uname)
{
	char *reference, *data;
	size_t s;

	assertUmask(0);
	assertMakeFile("file", 0644, "1234567890");

	/* Create archive with no special options. */
	failure("Error invoking %s c", testprog);
	assertEqualInt(0,
	    systemf("%s cf archive1 --format=ustar file >stdout1.txt 2>stderr1.txt",
		testprog));
	assertEmptyFile("stdout1.txt");
	assertEmptyFile("stderr1.txt");
	reference = slurpfile(&s, "archive1");

	/* Again with both --uid and --uname */
	failure("Error invoking %s c", testprog);
	assertEqualInt(0,
	    systemf("%s cf archive2 --uid=17 --uname=foofoofoo --format=ustar file >stdout2.txt 2>stderr2.txt",
		testprog));
	assertEmptyFile("stdout2.txt");
	assertEmptyFile("stderr2.txt");
	data = slurpfile(&s, "archive2");
	/* Should force uid and uname fields in ustar header. */
	assertEqualMem(data + 108, "000021 \0", 8);
	assertEqualMem(data + 265, "foofoofoo\0", 10);

	/* Again with just --uid */
	failure("Error invoking %s c", testprog);
	assertEqualInt(0,
	    systemf("%s cf archive3 --uid=17 --format=ustar file >stdout3.txt 2>stderr3.txt",
		testprog));
	assertEmptyFile("stdout3.txt");
	assertEmptyFile("stderr3.txt");
	data = slurpfile(&s, "archive3");
	assertEqualMem(data + 108, "000021 \0", 8);
	/* Uname field in ustar header should be empty. */
	assertEqualMem(data + 265, "\0", 1);

	/* Again with just --uname */
	failure("Error invoking %s c", testprog);
	assertEqualInt(0,
	    systemf("%s cf archive4 --uname=foofoofoo --format=ustar file >stdout4.txt 2>stderr4.txt",
		testprog));
	assertEmptyFile("stdout4.txt");
	assertEmptyFile("stderr4.txt");
	data = slurpfile(&s, "archive4");
	/* Uid should be unchanged from original reference. */
	assertEqualMem(data + 108, reference + 108, 8);
	assertEqualMem(data + 265, "foofoofoo\0", 10);
}